

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O0

shared_ptr<MyCompiler::Expression> __thiscall
MyCompiler::RecursiveDescentParser::parse<MyCompiler::Expression>(RecursiveDescentParser *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  element_type *peVar8;
  SyntaxError *this_00;
  char *pcVar9;
  element_type *peVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  long in_RSI;
  shared_ptr<MyCompiler::Expression> sVar12;
  allocator local_a1;
  string local_a0 [32];
  undefined1 local_80 [8];
  shared_ptr<MyCompiler::Term> p2;
  shared_ptr<MyCompiler::AddSubOp> p1;
  undefined1 local_50 [32];
  undefined1 local_30 [32];
  RecursiveDescentParser *this_local;
  shared_ptr<MyCompiler::Expression> *pResult;
  
  local_30[0x17] = 0;
  this_local = this;
  std::make_shared<MyCompiler::Expression>();
  if ((*(int *)(in_RSI + 0x30) == 3) || (*(int *)(in_RSI + 0x30) == 4)) {
    parse<MyCompiler::AddSubOp>((RecursiveDescentParser *)local_30);
    peVar4 = std::
             __shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    std::shared_ptr<MyCompiler::AddSubOp>::operator=
              (&peVar4->pAddSubOp,(shared_ptr<MyCompiler::AddSubOp> *)local_30);
    std::shared_ptr<MyCompiler::AddSubOp>::~shared_ptr((shared_ptr<MyCompiler::AddSubOp> *)local_30)
    ;
  }
  parse<MyCompiler::Term>((RecursiveDescentParser *)local_50);
  peVar4 = std::
           __shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<MyCompiler::Term>::operator=
            (&peVar4->pTerm,(shared_ptr<MyCompiler::Term> *)local_50);
  std::shared_ptr<MyCompiler::Term>::~shared_ptr((shared_ptr<MyCompiler::Term> *)local_50);
  peVar4 = std::
           __shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  bVar2 = std::operator!=(&peVar4->pAddSubOp,(nullptr_t)0x0);
  _Var11._M_pi = extraout_RDX;
  if (bVar2) {
    peVar4 = std::
             __shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    peVar5 = std::__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&peVar4->pTerm);
    peVar6 = std::__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar5->pFactor);
    _Var11._M_pi = extraout_RDX_00;
    if ((peVar6->super_AbstractAstNode).caseNum == 1) {
      peVar4 = std::
               __shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      peVar5 = std::__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar4->pTerm);
      bVar2 = std::
              vector<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>,_std::allocator<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>_>_>
              ::empty(&peVar5->vMulDivOpFactor);
      _Var11._M_pi = extraout_RDX_01;
      if (bVar2) {
        peVar4 = std::
                 __shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        peVar10 = std::
                  __shared_ptr_access<MyCompiler::AddSubOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<MyCompiler::AddSubOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&peVar4->pAddSubOp);
        bVar2 = std::operator==(&(peVar10->super_AbstractAstNode).value,"-");
        if (bVar2) {
          peVar4 = std::
                   __shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)this);
          peVar5 = std::
                   __shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&peVar4->pTerm);
          peVar6 = std::
                   __shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&peVar5->pFactor);
          peVar7 = std::
                   __shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&peVar6->pNumber);
          peVar4 = std::
                   __shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)this);
          peVar5 = std::
                   __shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&peVar4->pTerm);
          peVar6 = std::
                   __shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&peVar5->pFactor);
          peVar8 = std::
                   __shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&peVar6->pNumber);
          Number::setNum(peVar7,-peVar8->num);
        }
        std::shared_ptr<MyCompiler::AddSubOp>::shared_ptr
                  ((shared_ptr<MyCompiler::AddSubOp> *)
                   &p1.super___shared_ptr<MyCompiler::AddSubOp,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(nullptr_t)0x0);
        peVar4 = std::
                 __shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        std::shared_ptr<MyCompiler::AddSubOp>::operator=
                  (&peVar4->pAddSubOp,
                   (shared_ptr<MyCompiler::AddSubOp> *)
                   &p1.super___shared_ptr<MyCompiler::AddSubOp,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::shared_ptr<MyCompiler::AddSubOp>::~shared_ptr
                  ((shared_ptr<MyCompiler::AddSubOp> *)
                   &p1.super___shared_ptr<MyCompiler::AddSubOp,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        _Var11._M_pi = extraout_RDX_02;
      }
    }
  }
  do {
    bVar2 = true;
    if (*(int *)(in_RSI + 0x30) != 3) {
      bVar2 = *(int *)(in_RSI + 0x30) == 4;
    }
    if (!bVar2) {
      sVar12.super___shared_ptr<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = _Var11._M_pi;
      sVar12.super___shared_ptr<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (shared_ptr<MyCompiler::Expression>)
             sVar12.super___shared_ptr<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2>;
    }
    parse<MyCompiler::AddSubOp>
              ((RecursiveDescentParser *)
               &p2.super___shared_ptr<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    parse<MyCompiler::Term>((RecursiveDescentParser *)local_80);
    peVar4 = std::
             __shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    peVar5 = std::__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&peVar4->pTerm);
    peVar6 = std::__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar5->pFactor);
    if ((peVar6->super_AbstractAstNode).caseNum == 1) {
      peVar4 = std::
               __shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      bVar2 = std::
              vector<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>,_std::allocator<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>_>_>
              ::empty(&peVar4->vAddSubOpExpression);
      if (!bVar2) goto LAB_00106e2f;
      peVar5 = std::__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_80);
      peVar6 = std::
               __shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar5->pFactor);
      if ((peVar6->super_AbstractAstNode).caseNum != 1) goto LAB_00106e2f;
      peVar5 = std::__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_80);
      bVar2 = std::
              vector<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>,_std::allocator<std::pair<MyCompiler::MulDivOp,_MyCompiler::Factor>_>_>
              ::empty(&peVar5->vMulDivOpFactor);
      if (!bVar2) goto LAB_00106e2f;
      peVar10 = std::
                __shared_ptr_access<MyCompiler::AddSubOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<MyCompiler::AddSubOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&p2.super___shared_ptr<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount);
      bVar2 = std::operator==(&(peVar10->super_AbstractAstNode).value,"+");
      if (bVar2) {
        peVar4 = std::
                 __shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        peVar5 = std::
                 __shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar4->pTerm);
        peVar6 = std::
                 __shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar5->pFactor);
        peVar7 = std::
                 __shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar6->pNumber);
        peVar4 = std::
                 __shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        peVar5 = std::
                 __shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar4->pTerm);
        peVar6 = std::
                 __shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar5->pFactor);
        peVar8 = std::
                 __shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar6->pNumber);
        lVar1 = peVar8->num;
        peVar5 = std::
                 __shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_80);
        peVar6 = std::
                 __shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar5->pFactor);
        peVar8 = std::
                 __shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar6->pNumber);
        Number::setNum(peVar7,lVar1 + peVar8->num);
      }
      else {
        peVar4 = std::
                 __shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        peVar5 = std::
                 __shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar4->pTerm);
        peVar6 = std::
                 __shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar5->pFactor);
        peVar7 = std::
                 __shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar6->pNumber);
        peVar4 = std::
                 __shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        peVar5 = std::
                 __shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar4->pTerm);
        peVar6 = std::
                 __shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar5->pFactor);
        peVar8 = std::
                 __shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar6->pNumber);
        lVar1 = peVar8->num;
        peVar5 = std::
                 __shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_80);
        peVar6 = std::
                 __shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar5->pFactor);
        peVar8 = std::
                 __shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar6->pNumber);
        Number::setNum(peVar7,lVar1 - peVar8->num);
      }
      peVar4 = std::
               __shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      peVar5 = std::__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar4->pTerm);
      peVar6 = std::
               __shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar5->pFactor);
      peVar7 = std::
               __shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar6->pNumber);
      lVar1 = peVar7->num;
      iVar3 = std::numeric_limits<int>::max();
      if (iVar3 < lVar1) {
LAB_00106d0c:
        this_00 = (SyntaxError *)__cxa_allocate_exception(0x10);
        peVar10 = std::
                  __shared_ptr_access<MyCompiler::AddSubOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<MyCompiler::AddSubOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&p2.
                                   super___shared_ptr<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount);
        bVar2 = std::operator==(&(peVar10->super_AbstractAstNode).value,"+");
        pcVar9 = "attempt to subtract with overflow";
        if (bVar2) {
          pcVar9 = "attempt to add with overflow";
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a0,pcVar9,&local_a1);
        SyntaxError::SyntaxError(this_00,(string *)local_a0);
        __cxa_throw(this_00,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
      }
      peVar4 = std::
               __shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      peVar5 = std::__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar4->pTerm);
      peVar6 = std::
               __shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MyCompiler::Factor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar5->pFactor);
      peVar7 = std::
               __shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar6->pNumber);
      lVar1 = peVar7->num;
      iVar3 = std::numeric_limits<int>::min();
      if (lVar1 < iVar3) goto LAB_00106d0c;
    }
    else {
LAB_00106e2f:
      peVar4 = std::
               __shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      peVar10 = std::
                __shared_ptr_access<MyCompiler::AddSubOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<MyCompiler::AddSubOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&p2.super___shared_ptr<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
      peVar5 = std::__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_80);
      std::
      vector<std::pair<MyCompiler::AddSubOp,MyCompiler::Term>,std::allocator<std::pair<MyCompiler::AddSubOp,MyCompiler::Term>>>
      ::emplace_back<MyCompiler::AddSubOp&,MyCompiler::Term&>
                ((vector<std::pair<MyCompiler::AddSubOp,MyCompiler::Term>,std::allocator<std::pair<MyCompiler::AddSubOp,MyCompiler::Term>>>
                  *)&peVar4->vAddSubOpExpression,peVar10,peVar5);
    }
    std::shared_ptr<MyCompiler::Term>::~shared_ptr((shared_ptr<MyCompiler::Term> *)local_80);
    std::shared_ptr<MyCompiler::AddSubOp>::~shared_ptr
              ((shared_ptr<MyCompiler::AddSubOp> *)
               &p2.super___shared_ptr<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    _Var11._M_pi = extraout_RDX_03;
  } while( true );
}

Assistant:

std::shared_ptr<MyCompiler::Expression> MyCompiler::RecursiveDescentParser::parse()
{
    auto pResult = std::make_shared<Expression>();

    if (sym == SymbolType::PLUS || sym == SymbolType::MINUS)
        pResult->pAddSubOp = parse<AddSubOp>();
    pResult->pTerm = parse<Term>();
    if (pResult->pAddSubOp != nullptr && pResult->pTerm->pFactor->caseNum == 1 &&
        pResult->pTerm->vMulDivOpFactor.empty())
    {
        if (pResult->pAddSubOp->value == "-")
            pResult->pTerm->pFactor->pNumber->setNum(-pResult->pTerm->pFactor->pNumber->num);
        pResult->pAddSubOp = nullptr;
    }
    while (sym == SymbolType::PLUS || sym == SymbolType::MINUS)
    {
        auto p1 = parse<AddSubOp>();
        auto p2 = parse<Term>();
        if (pResult->pTerm->pFactor->caseNum == 1 && pResult->vAddSubOpExpression.empty() &&
            p2->pFactor->caseNum == 1 && p2->vMulDivOpFactor.empty())
        {
            if (p1->value == "+")
                pResult->pTerm->pFactor->pNumber->setNum(
                        pResult->pTerm->pFactor->pNumber->num + p2->pFactor->pNumber->num);
            else
                pResult->pTerm->pFactor->pNumber->setNum(
                        pResult->pTerm->pFactor->pNumber->num - p2->pFactor->pNumber->num);
            if (pResult->pTerm->pFactor->pNumber->num > std::numeric_limits<int32_t>::max()
                || pResult->pTerm->pFactor->pNumber->num < std::numeric_limits<int32_t>::min())
                throw SyntaxError(
                        p1->value == "+" ? "attempt to add with overflow" : "attempt to subtract with overflow");
        }
        else
            pResult->vAddSubOpExpression.emplace_back(*p1, *p2);
    }

    return pResult;
}